

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DArray.hpp
# Opt level: O2

void __thiscall
Lib::DArray<std::pair<unsigned_int,unsigned_int>>::
sortGen<false,Indexing::CodeTree::ILStruct::GVArrComparator>
          (DArray<std::pair<unsigned_int,unsigned_int>> *this)

{
  uint uVar1;
  long lVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  unsigned_long *puVar5;
  int iVar6;
  ulong uVar7;
  uint uVar8;
  undefined4 uVar9;
  ulong uVar10;
  ulong uVar11;
  unsigned_long uVar12;
  unsigned_long s;
  long lVar13;
  
  if (*(ulong *)this < 2) {
    return;
  }
  if ((sortGen<false,Indexing::CodeTree::ILStruct::GVArrComparator>(Indexing::CodeTree::ILStruct::GVArrComparator)
       ::ft == '\0') &&
     (iVar6 = __cxa_guard_acquire(&sortGen<false,Indexing::CodeTree::ILStruct::GVArrComparator>(Indexing::CodeTree::ILStruct::GVArrComparator)
                                   ::ft), iVar6 != 0)) {
    DArray<unsigned_long>::DArray
              (&DArray<std::pair<unsigned_int,_unsigned_int>_>::
                sortGen<false,_Indexing::CodeTree::ILStruct::GVArrComparator>::ft,0x20);
    __cxa_atexit(DArray<unsigned_long>::~DArray,
                 &DArray<std::pair<unsigned_int,_unsigned_int>_>::
                  sortGen<false,_Indexing::CodeTree::ILStruct::GVArrComparator>::ft,&__dso_handle);
    __cxa_guard_release(&sortGen<false,Indexing::CodeTree::ILStruct::GVArrComparator>(Indexing::CodeTree::ILStruct::GVArrComparator)
                         ::ft);
  }
  s = *(long *)this - 1;
  DArray<unsigned_long>::ensure
            (&DArray<std::pair<unsigned_int,_unsigned_int>_>::
              sortGen<false,_Indexing::CodeTree::ILStruct::GVArrComparator>::ft,s);
  uVar12 = 0;
  lVar13 = 0;
LAB_00286d70:
  iVar6 = Random::getInteger(((int)s - (int)uVar12) + 1);
  lVar2 = *(long *)(this + 0x10);
  uVar3 = *(undefined8 *)(lVar2 + ((long)iVar6 + uVar12) * 8);
  uVar7 = (long)iVar6 + uVar12;
  uVar10 = s;
  uVar11 = uVar12;
  while( true ) {
    uVar8 = (uint)uVar3;
    uVar9 = (undefined4)((ulong)uVar3 >> 0x20);
    if (uVar7 <= uVar11) break;
    uVar1 = *(uint *)(lVar2 + uVar11 * 8);
    if (uVar8 < uVar1) {
      if (uVar7 == uVar10) {
        *(uint *)(lVar2 + uVar7 * 8) = uVar1;
        *(undefined4 *)(lVar2 + 4 + uVar7 * 8) = *(undefined4 *)(lVar2 + 4 + uVar11 * 8);
        uVar10 = uVar7 - 1;
        *(undefined8 *)(lVar2 + uVar11 * 8) = *(undefined8 *)(lVar2 + -8 + uVar7 * 8);
        *(uint *)(lVar2 + -8 + uVar7 * 8) = uVar8;
        *(undefined4 *)(lVar2 + -4 + uVar7 * 8) = uVar9;
        uVar7 = uVar10;
      }
      else {
        uVar4 = *(undefined8 *)(lVar2 + uVar11 * 8);
        *(undefined8 *)(lVar2 + uVar11 * 8) = *(undefined8 *)(lVar2 + uVar10 * 8);
        *(int *)(lVar2 + uVar10 * 8) = (int)uVar4;
        *(int *)(lVar2 + 4 + uVar10 * 8) = (int)((ulong)uVar4 >> 0x20);
        uVar10 = uVar10 - 1;
      }
    }
    else {
      uVar11 = uVar11 + 1;
    }
  }
  do {
    uVar11 = uVar7 + 1;
    while( true ) {
      puVar5 = DArray<std::pair<unsigned_int,_unsigned_int>_>::
               sortGen<false,_Indexing::CodeTree::ILStruct::GVArrComparator>::ft._array;
      if (uVar10 <= uVar7) {
        if (uVar11 < s) {
          DArray<std::pair<unsigned_int,_unsigned_int>_>::
          sortGen<false,_Indexing::CodeTree::ILStruct::GVArrComparator>::ft._array[lVar13] = uVar11;
          puVar5[lVar13 + 1] = s;
          lVar13 = lVar13 + 2;
        }
        s = uVar7 - 1;
        if ((uVar7 == 0) || (s <= uVar12)) {
          if (lVar13 == 0) {
            return;
          }
          uVar12 = DArray<std::pair<unsigned_int,_unsigned_int>_>::
                   sortGen<false,_Indexing::CodeTree::ILStruct::GVArrComparator>::ft._array
                   [lVar13 + -2];
          s = DArray<std::pair<unsigned_int,_unsigned_int>_>::
              sortGen<false,_Indexing::CodeTree::ILStruct::GVArrComparator>::ft._array[lVar13 + -1];
          lVar13 = lVar13 + -2;
        }
        goto LAB_00286d70;
      }
      uVar1 = *(uint *)(lVar2 + uVar11 * 8);
      if (uVar1 <= uVar8) break;
      uVar3 = *(undefined8 *)(lVar2 + uVar10 * 8);
      *(uint *)(lVar2 + uVar10 * 8) = uVar1;
      *(undefined4 *)(lVar2 + 4 + uVar10 * 8) = *(undefined4 *)(lVar2 + 4 + uVar11 * 8);
      *(int *)(lVar2 + uVar11 * 8) = (int)uVar3;
      *(int *)(lVar2 + 4 + uVar11 * 8) = (int)((ulong)uVar3 >> 0x20);
      uVar10 = uVar10 - 1;
    }
    *(uint *)(lVar2 + uVar7 * 8) = uVar1;
    *(undefined4 *)(lVar2 + -4 + uVar11 * 8) = *(undefined4 *)(lVar2 + 4 + uVar11 * 8);
    *(uint *)(lVar2 + uVar11 * 8) = uVar8;
    *(undefined4 *)(lVar2 + 4 + uVar11 * 8) = uVar9;
    uVar7 = uVar11;
  } while( true );
}

Assistant:

void sortGen(Comparator comp)
  {
    if(_size <= 1) {
      return;
    }

    // array behaves as a stack of calls to quicksort
    static DArray<size_t> ft(32);

    size_t from = 0;
    size_t to=size()-1;
    ft.ensure(to);

    size_t p = 0; // pointer to the next element in ft
    for (;;) {
      ASS(from<size() && to<size()); //checking for underflows
      ASS(from<to);
      // invariant: from < to
      size_t m = from + Random::getInteger(to-from+1);
      C mid = (*this)[m];
      size_t l = from;
      size_t r = to;
      while (l < m) {
        switch ((Inversed?-1:1)*comp.compare((*this)[l],mid))
  	{
  	case EQUAL:
  	case LESS:
  	  l++;
  	  break;
  	case GREATER:
  	  if (m == r) {
  	    (*this)[m] = (*this)[l];
  	    (*this)[l] = (*this)[m-1];
  	    (*this)[m-1] = mid;
  	    m--;
  	    r--;
  	  }
  	  else {
  	    ASS(m < r);
  	    C aux = (*this)[l];
  	    (*this)[l] = (*this)[r];
  	    (*this)[r] = aux;
  	    r--;
  	  }
  	  break;
  	}
      }
      // l == m
      // now literals in lits[from ... m-1] are smaller than lits[m]
      // and literals in lits[r+1 ... to] are greater than lits[m]
      while (m < r) {
        switch ((Inversed?-1:1)*comp.compare(mid,(*this)[m+1]))
  	{
  	case LESS:
  	  {
  	    C aux = (*this)[r];
  	    (*this)[r] = (*this)[m+1];
  	    (*this)[m+1] = aux;
  	    r--;
  	  }
  	  break;
  	case EQUAL:
  	case GREATER:
  	  (*this)[m] = (*this)[m+1];
  	  (*this)[m+1] = mid;
  	  m++;
  	}
      }
      // now literals in lits[from ... m-1] are smaller than lits[m]
      // and all literals in lits[m+1 ... to] are greater than lits[m]
      if (m+1 < to) {
        ft[p++] = m+1;
        ft[p++] = to;
      }

      to = m-1;
      if (m!=0 && from < to) {
        continue;
      }
      if (p != 0) {
        p -= 2;
        ASS(p >= 0);
        from = ft[p];
        to = ft[p+1];
        continue;
      }
      return;
    }
  }